

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

Read<int> __thiscall
Omega_h::graph_reduce<int>(Omega_h *this,Graph *a2b,Read<int> *b_data,Int width,Omega_h_Op op)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Read<int> ab_data;
  LOs ab2b;
  LOs a2ab;
  Write<int> WStack_a8;
  Write<int> local_98;
  Write<int> local_88;
  Write<int> local_78;
  Write<int> local_68;
  Write<int> local_58;
  Write<int> local_48;
  Write<int> local_38;
  
  Write<int>::Write(&local_38,(Write<int> *)a2b);
  Write<int>::Write(&local_48,&(a2b->ab2b).write_);
  Write<int>::Write(&local_78,&local_48);
  Write<int>::Write(&local_88,&b_data->write_);
  unmap<int>((Omega_h *)&local_68,(LOs *)&local_78,(Read<int> *)&local_88,width);
  read<int>((Omega_h *)&local_58,&local_68);
  Write<int>::~Write(&local_68);
  Write<int>::~Write(&local_88);
  Write<int>::~Write(&local_78);
  Write<int>::Write(&local_98,&local_38);
  Write<int>::Write(&WStack_a8,&local_58);
  fan_reduce<int>(this,(LOs *)&local_98,(Read<int> *)&WStack_a8,width,op);
  Write<int>::~Write(&WStack_a8);
  Write<int>::~Write(&local_98);
  Write<int>::~Write(&local_58);
  Write<int>::~Write(&local_48);
  Write<int>::~Write(&local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> graph_reduce(Graph a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  auto a2ab = a2b.a2ab;
  auto ab2b = a2b.ab2b;
  auto ab_data = read(unmap(ab2b, b_data, width));
  return fan_reduce(a2ab, ab_data, width, op);
}